

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

int quorem(Bigint *b,Bigint *S)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint32 *puVar11;
  uint32 *puVar12;
  uint32 *puVar13;
  uint32 *puVar14;
  ulong uVar15;
  long lVar16;
  uint32 *puVar17;
  
  iVar1 = S->wds;
  lVar6 = (long)iVar1;
  iVar4 = 0;
  if (iVar1 <= b->wds) {
    puVar11 = S->x;
    uVar10 = lVar6 - 1;
    puVar12 = S->x + lVar6 + -1;
    puVar13 = b->x;
    uVar3 = (ulong)b->x[lVar6 + -1] / (ulong)(*puVar12 + 1);
    iVar4 = (int)uVar3;
    if (*puVar12 + 1 <= b->x[lVar6 + -1]) {
      lVar7 = 0;
      uVar15 = 0;
      puVar14 = puVar11;
      puVar17 = puVar13;
      do {
        uVar5 = *puVar14;
        puVar14 = puVar14 + 1;
        uVar8 = uVar5 * uVar3 + uVar15;
        uVar15 = uVar8 >> 0x20;
        lVar16 = ((ulong)*puVar17 - (uVar8 & 0xffffffff)) + lVar7;
        lVar7 = lVar16 >> 0x20;
        *puVar17 = (uint)lVar16;
        puVar17 = puVar17 + 1;
      } while (puVar14 <= puVar12);
      if (b->x[lVar6 + -1] == 0) {
        if (2 < iVar1) {
          lVar6 = lVar6 * 4 + 0x14;
          do {
            if (*(int *)((long)b->x + lVar6 + -0x1c) != 0) break;
            uVar10 = (ulong)((int)uVar10 - 1);
            lVar6 = lVar6 + -4;
          } while (0x1c < lVar6);
        }
        b->wds = (int)uVar10;
      }
    }
    uVar9 = (uint)uVar10;
    uVar5 = b->wds - S->wds;
    if (uVar5 == 0) {
      lVar6 = (long)S->wds * 4 + 0x1c;
      do {
        uVar5 = *(uint *)((long)b->x + lVar6 + -0x20);
        uVar2 = *(uint *)((long)S->x + lVar6 + -0x20);
        if (uVar5 != uVar2) {
          uVar5 = -(uint)(uVar5 < uVar2) | 1;
          goto LAB_0010e012;
        }
        lVar6 = lVar6 + -4;
      } while (0x1c < lVar6);
      uVar5 = 0;
    }
LAB_0010e012:
    if (-1 < (int)uVar5) {
      lVar6 = 0;
      do {
        uVar5 = *puVar11;
        puVar11 = puVar11 + 1;
        lVar7 = ((ulong)*puVar13 - (ulong)uVar5) + lVar6;
        lVar6 = lVar7 >> 0x20;
        *puVar13 = (uint)lVar7;
        puVar13 = puVar13 + 1;
      } while (puVar11 <= puVar12);
      iVar4 = iVar4 + 1;
      if (b->x[(int)uVar9] == 0) {
        if (1 < (int)uVar9) {
          lVar6 = (long)(int)uVar9 * 4 + 0x18;
          do {
            uVar9 = (uint)uVar10;
            if (*(int *)((long)b->x + lVar6 + -0x1c) != 0) break;
            uVar9 = uVar9 - 1;
            uVar10 = (ulong)uVar9;
            lVar6 = lVar6 + -4;
          } while (0x1c < lVar6);
        }
        b->wds = uVar9;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
quorem(Bigint *b, Bigint *S)
{
    int n;
    ULong *bx, *bxe, q, *sx, *sxe;
#ifdef ULLong
    ULLong borrow, carry, y, ys;
#else
    ULong borrow, carry, y, ys;
    ULong si, z, zs;
#endif

    n = S->wds;
#ifdef DEBUG
    /*debug*/ if (b->wds > n)
        /*debug*/       Bug("oversize b in quorem");
#endif
    if (b->wds < n)
        return 0;
    sx = S->x;
    sxe = sx + --n;
    bx = b->x;
    bxe = bx + n;
    q = *bxe / (*sxe + 1);      /* ensure q <= true quotient */
#ifdef DEBUG
    /*debug*/ if (q > 9)
        /*debug*/       Bug("oversized quotient in quorem");
#endif
    if (q) {
        borrow = 0;
        carry = 0;
        do {
#ifdef ULLong
            ys = *sx++ * (ULLong)q + carry;
            carry = ys >> 32;
            y = *bx - (ys & FFFFFFFF) - borrow;
            borrow = y >> 32 & (ULong)1;
            *bx++ = (ULong)(y & FFFFFFFF);
#else
            si = *sx++;
            ys = (si & 0xffff) * q + carry;
            zs = (si >> 16) * q + (ys >> 16);
            carry = zs >> 16;
            y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
            borrow = (y & 0x10000) >> 16;
            z = (*bx >> 16) - (zs & 0xffff) - borrow;
            borrow = (z & 0x10000) >> 16;
            Storeinc(bx, z, y);
#endif
        }
        while(sx <= sxe);
        if (!*bxe) {
            bx = b->x;
            while(--bxe > bx && !*bxe)
                --n;
            b->wds = n;
        }
    }
    if (cmp(b, S) >= 0) {
        q++;
        borrow = 0;
        carry = 0;
        bx = b->x;
        sx = S->x;
        do {
#ifdef ULLong
            ys = *sx++ + carry;
            carry = ys >> 32;
            y = *bx - (ys & FFFFFFFF) - borrow;
            borrow = y >> 32 & (ULong)1;
            *bx++ = (ULong)(y & FFFFFFFF);
#else
            si = *sx++;
            ys = (si & 0xffff) + carry;
            zs = (si >> 16) + (ys >> 16);
            carry = zs >> 16;
            y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
            borrow = (y & 0x10000) >> 16;
            z = (*bx >> 16) - (zs & 0xffff) - borrow;
            borrow = (z & 0x10000) >> 16;
            Storeinc(bx, z, y);
#endif
        }
        while(sx <= sxe);
        bx = b->x;
        bxe = bx + n;
        if (!*bxe) {
            while(--bxe > bx && !*bxe)
                --n;
            b->wds = n;
        }
    }
    return q;
}